

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match.cc
# Opt level: O2

bool __thiscall absl::StrContainsIgnoreCase(absl *this,string_view haystack,char needle)

{
  bool bVar1;
  size_type sVar2;
  ulong uVar3;
  string_view haystack_00;
  char both_cstr [3];
  char local_13;
  char local_12;
  undefined1 local_11;
  basic_string_view<char,_std::char_traits<char>_> local_10;
  
  haystack_00._M_len = (char *)haystack._M_len;
  uVar3 = (ulong)haystack._M_str & 0xff;
  local_12 = ascii_internal::kToUpper[uVar3];
  local_13 = ascii_internal::kToLower[uVar3];
  local_10._M_len = (size_t)this;
  local_10._M_str = haystack_00._M_len;
  if (local_12 == local_13) {
    haystack_00._M_str._0_4_ = (int)(char)haystack._M_str;
    haystack_00._M_str._4_4_ = 0;
    bVar1 = StrContains(this,haystack_00,local_13);
    return bVar1;
  }
  local_11 = 0;
  sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                    (&local_10,&local_13,0);
  return sVar2 != 0xffffffffffffffff;
}

Assistant:

bool StrContainsIgnoreCase(absl::string_view haystack,
                           char needle) noexcept {
  char upper_needle = absl::ascii_toupper(static_cast<unsigned char>(needle));
  char lower_needle = absl::ascii_tolower(static_cast<unsigned char>(needle));
  if (upper_needle == lower_needle) {
    return StrContains(haystack, needle);
  } else {
    const char both_cstr[3] = {lower_needle, upper_needle, '\0'};
    return haystack.find_first_of(both_cstr) != absl::string_view::npos;
  }
}